

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

SampledSpectrum *
phyr::SampledSpectrum::getFromSample
          (SampledSpectrum *__return_storage_ptr__,double *lambda,double *v,int n)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  vector<double,_std::allocator<double>_> vv;
  vector<double,_std::allocator<double>_> vl;
  allocator_type local_51;
  double *local_50 [3];
  double *local_38 [3];
  
  bVar3 = n < 2;
  if (1 < n) {
    if (lambda[1] <= *lambda && *lambda != lambda[1]) goto LAB_00126492;
    uVar1 = 2;
    do {
      uVar2 = uVar1;
      if ((uint)n == uVar2) break;
      uVar1 = uVar2 + 1;
    } while (lambda[uVar2 - 1] < lambda[uVar2] || lambda[uVar2 - 1] == lambda[uVar2]);
    bVar3 = (uint)n <= uVar2;
  }
  if (bVar3) {
    _getFromSample(__return_storage_ptr__,lambda,v,n);
    return __return_storage_ptr__;
  }
LAB_00126492:
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)local_38,lambda,lambda + (long)n + -1,
             (allocator_type *)local_50);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)local_50,v,v + (long)n + -1,&local_51);
  sortSampleSpace(local_38[0],local_50[0],n);
  _getFromSample(__return_storage_ptr__,local_38[0],local_50[0],n);
  if (local_50[0] != (double *)0x0) {
    operator_delete(local_50[0]);
  }
  if (local_38[0] != (double *)0x0) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

SampledSpectrum SampledSpectrum::getFromSample(const Real* lambda, const Real* v, int n) {
    // Generate sorted sample space
    if (!isSampleSpaceSorted(lambda, n)) {
        std::vector<Real> vl(&lambda[0], &lambda[n-1]);
        std::vector<Real> vv(&v[0], &v[n-1]);

        sortSampleSpace(&vl[0], &vv[0], n);
        return _getFromSample(&vl[0], &vv[0], n);
    }

    return _getFromSample(lambda, v, n);
}